

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

double max(DataSet *dataset)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  uint i;
  uint index;
  double dVar2;
  Matrix<double> mat;
  double local_78;
  Matrix<double> local_70;
  
  DataSet::matrix(&local_70,dataset);
  pvVar1 = Matrix<double>::operator[](&local_70,0);
  local_78 = *(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  for (index = 0; index < local_70.m_shape.n_row; index = index + 1) {
    pvVar1 = Matrix<double>::operator[](&local_70,index);
    dVar2 = max(pvVar1);
    if (local_78 < dVar2) {
      pvVar1 = Matrix<double>::operator[](&local_70,index);
      local_78 = max(pvVar1);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_70.m_elems);
  return local_78;
}

Assistant:

double max(const DataSet& dataset){
    Matrix_d mat=dataset.matrix();
    double result=mat[0][0];
    for(unsigned i=0;i<mat.shape().n_row;++i){
        if(result<max(mat[i])) result=max(mat[i]);
    }
    return result;
}